

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drive-test.cpp
# Opt level: O1

void __thiscall control::terminate_on_key(control *this)

{
  thread t;
  long local_20;
  long *local_18;
  
  local_20 = 0;
  local_18 = (long *)operator_new(0x10);
  *local_18 = (long)&PTR___State_0011cbc8;
  local_18[1] = (long)this;
  std::thread::_M_start_thread(&local_20,&local_18,0);
  if (local_18 != (long *)0x0) {
    (**(code **)(*local_18 + 8))();
  }
  std::thread::detach();
  if (local_20 == 0) {
    return;
  }
  std::terminate();
}

Assistant:

void control::terminate_on_key()
{
 #ifndef NO_LINUX_HEADERS
  thread t([&] () {
    int fd = open("/dev/input/by-path/platform-gpio-keys.0-event", O_RDONLY);
    if (fd  < 0)
    {
      cout << "Couldn't open platform-gpio-keys device!" << endl;
      return;
    }

    input_event ev;
    while (true)
    {
      size_t rb = read(fd, &ev, sizeof(ev));

      if (rb < sizeof(input_event))
        continue;

      if ((ev.type == EV_KEY) /*&& (ev.value == KEY_PRESS)*/)
      {
        terminate();
        return;
      }
    }
  });
  t.detach();
 #endif
}